

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

Float modelQuantization(Float value,PixelFormat format)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = value;
  if (format != Float) {
    if (format != Half) {
      pbrt::LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,100,"Unhandled pixel format");
    }
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar6 = vpandd_avx512vl(auVar7._0_16_,auVar6);
    fVar3 = auVar6._0_4_;
    if ((uint)fVar3 < 0x47800000) {
      if ((uint)fVar3 < 0x38800000) {
        fVar3 = fVar3 + 0.5;
      }
      else {
        fVar3 = (float)((int)fVar3 + 0x8000fff + (uint)(((uint)fVar3 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      fVar3 = (float)((0x7f800000 < (uint)fVar3 | 0x3e) << 9);
    }
    iVar1 = vmovmskps_avx(auVar7._0_16_);
    uVar2 = (uint)(iVar1 << 0x1f) >> 0x10;
    uVar4 = (uVar2 | (uint)fVar3 & 0xffff) << 0xd;
    if (((uint)fVar3 & 0x7c00) == 0x7c00) {
      fVar5 = (float)(uVar4 | 0x70000000);
    }
    else if (((uint)fVar3 & 0x7c00) == 0) {
      fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
    }
    else {
      fVar5 = (float)(((uint)fVar3 & 0x7fff) * 0x2000 + 0x38000000);
    }
    auVar7 = ZEXT464((uVar2 | (uint)fVar3 & 0x8000) << 0x10 | (uint)fVar5);
  }
  return auVar7._0_4_;
}

Assistant:

static Float modelQuantization(Float value, PixelFormat format) {
    switch (format) {
    case PixelFormat::U256:
        return Clamp((value * 255.f) + 0.5f, 0, 255) * (1.f / 255.f);
    case PixelFormat::Half:
        return Float(Half(value));
    case PixelFormat::Float:
        return value;
    default:
        LOG_FATAL("Unhandled pixel format");
    }
}